

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O3

status_t __thiscall
libtorrent::aux::posix_storage::initialize
          (posix_storage *this,settings_interface *param_1,storage_error *ec)

{
  int64_t iVar1;
  bool bVar2;
  int num_files;
  pointer psVar3;
  int64_t iVar4;
  file_index_t index;
  long lVar5;
  file_storage *pfVar6;
  status_t ret;
  error_code err;
  string file_path;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  file_status s;
  
  pfVar6 = (this->m_mapped_files)._M_t.
           super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
           .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (pfVar6 == (file_storage *)0x0) {
    pfVar6 = this->m_files;
  }
  num_files = file_storage::num_files(pfVar6);
  stat_cache::reserve(&this->m_stat_cache,num_files);
  pfVar6 = (this->m_mapped_files)._M_t.
           super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
           .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (pfVar6 == (file_storage *)0x0) {
    pfVar6 = this->m_files;
  }
  ret.m_val = '\0';
  psVar3 = (this->m_file_priority).
           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < *(int *)&(this->m_file_priority).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (int)psVar3) {
    lVar5 = 0;
    do {
      if (psVar3[lVar5].m_val == '\0') {
        index.m_val = (int)lVar5;
        bVar2 = file_storage::pad_file_at(pfVar6,index);
        if (!bVar2) {
          s.mode.m_val = 0;
          s.mtime = 0;
          s.ctime = 0;
          s.file_size = 0;
          s.atime = 0;
          file_storage::file_path(&file_path,pfVar6,index,&this->m_save_path);
          err.val_ = 0;
          err.failed_ = false;
          err.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                      super_error_category;
          stat_file(&file_path,&s,&err,(file_status_flag_t)0x0);
          iVar1 = s.file_size;
          iVar4 = file_storage::file_size(pfVar6,index);
          if (iVar4 < iVar1) {
            ret.m_val = '\b';
          }
          if (err.failed_ == false) {
            use_partfile(this,index,false);
          }
          else {
            need_partfile(this);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)file_path._M_dataplus._M_p != &file_path.field_2) {
            operator_delete(file_path._M_dataplus._M_p,file_path.field_2._M_allocated_capacity + 1);
          }
        }
      }
      lVar5 = lVar5 + 1;
      psVar3 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < *(int *)&(this->m_file_priority).
                              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                              .
                              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (int)psVar3);
  }
  local_78._8_8_ = 0;
  local_60 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:398:6)>
             ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:398:6)>
             ::_M_manager;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_object = create_symlink;
  local_98._M_invoker =
       ::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
       ::_M_manager;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = &ret;
  local_a0 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:401:6)>
             ::_M_invoke;
  local_a8 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:401:6)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  initialize_storage(pfVar6,&this->m_save_path,&this->m_stat_cache,&this->m_file_priority,
                     (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
                      *)&local_78,&local_98,
                     (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
                      *)&local_b8,ec);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return (status_t)ret.m_val;
}

Assistant:

status_t posix_storage::initialize(settings_interface const&, storage_error& ec)
	{
		m_stat_cache.reserve(files().num_files());

		file_storage const& fs = files();
		// if some files have priority 0, we need to check if they exist on the
		// filesystem, in which case we won't use a partfile for them.
		// this is to be backwards compatible with previous versions of
		// libtorrent, when part files were not supported.
		status_t ret{};
		for (file_index_t i(0); i < m_file_priority.end_index(); ++i)
		{
			if (m_file_priority[i] != dont_download || fs.pad_file_at(i))
				continue;

			file_status s;
			std::string const file_path = fs.file_path(i, m_save_path);
			error_code err;
			stat_file(file_path, &s, err);

			if (s.file_size > fs.file_size(i))
				ret |= disk_status::oversized_file;

			if (!err)
			{
				use_partfile(i, false);
			}
			else
			{
				need_partfile();
			}
		}

		aux::initialize_storage(fs, m_save_path, m_stat_cache, m_file_priority
			, [this](file_index_t const file_index, storage_error& e)
			{ open_file(file_index, aux::open_mode::write, 0, e); }
			, aux::create_symlink
			, [&ret](file_index_t, std::int64_t) { ret |= disk_status::oversized_file; }
			, ec);
		return ret;
	}